

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ssize_t __thiscall Reader::read(Reader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  size_type sVar3;
  int *piVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  undefined4 in_register_00000034;
  Gate local_138;
  Gate local_12c;
  Gate local_120;
  Gate local_114;
  Wall local_108;
  Pheromone local_100;
  Ant local_f8;
  char local_e1;
  int local_e0;
  int iStack_dc;
  char c;
  int x;
  int y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int local_98 [2];
  int sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string s;
  size_type sStack_40;
  int width;
  size_type prev;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string *text_local;
  Reader *this_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_00000034,__fd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pos);
  sStack_40 = 0;
  s.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_68);
  while (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,'\n',sStack_40),
        sVar2 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_88,
               lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,sStack_40,sVar2 - sStack_40);
    __x = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     &local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pos,__x);
    std::__cxx11::string::~string((string *)&local_88);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
    local_98[0] = (int)sVar3;
    piVar4 = std::max<int>(local_98,(int *)(s.field_2._M_local_buf + 0xc));
    s.field_2._12_4_ = *piVar4;
    sStack_40 = sVar2 + 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
             lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,sStack_40,0xffffffffffffffff);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pos,(value_type *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&pos);
  line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pos);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&line), ((bVar1 ^ 0xffU) & 1) != 0) {
    _x = __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    while (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(_x), sVar2 < (ulong)(long)(int)s.field_2._12_4_) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (_x," ");
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->lns,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pos);
  for (iStack_dc = 0; uVar5 = (ulong)iStack_dc,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->lns), uVar5 < sVar6; iStack_dc = iStack_dc + 1) {
    local_e0 = 0;
    while( true ) {
      uVar5 = (ulong)local_e0;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->lns,(long)iStack_dc);
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (pvVar7);
      if (sVar2 <= uVar5) break;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->lns,(long)iStack_dc);
      pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (pvVar7,(long)local_e0);
      local_e1 = *pvVar8;
      if (local_e1 == ':') {
        Ant::Ant(&local_f8,local_e0,iStack_dc);
        std::vector<Ant,_std::allocator<Ant>_>::emplace_back<Ant>(&this->nts,&local_f8);
      }
      else if (local_e1 == '.') {
        Pheromone::Pheromone(&local_100,local_e0,iStack_dc);
        std::vector<Pheromone,_std::allocator<Pheromone>_>::emplace_back<Pheromone>
                  (&this->phrs,&local_100);
      }
      else if ((local_e1 == '-') || (local_e1 == '|')) {
        Wall::Wall(&local_108,local_e0,iStack_dc);
        std::vector<Wall,_std::allocator<Wall>_>::emplace_back<Wall>(&this->wls,&local_108);
      }
      else if (local_e1 == '>') {
        Gate::Gate(&local_114,local_e0,iStack_dc,2);
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(&this->gts,&local_114);
      }
      else if (local_e1 == '^') {
        Gate::Gate(&local_120,local_e0,iStack_dc,1);
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(&this->gts,&local_120);
      }
      else if (local_e1 == '<') {
        Gate::Gate(&local_12c,local_e0,iStack_dc,0);
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(&this->gts,&local_12c);
      }
      else if (local_e1 == '~') {
        Gate::Gate(&local_138,local_e0,iStack_dc,3);
        std::vector<Gate,_std::allocator<Gate>_>::emplace_back<Gate>(&this->gts,&local_138);
      }
      local_e0 = local_e0 + 1;
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&pos);
  return (ssize_t)this;
}

Assistant:

Reader& read(const string & text) {
            vector<string> lines;
            string::size_type pos;
            string::size_type prev = 0;
            int width = 0;

            string s;
            while ((pos = text.find('\n', prev)) != string::npos) {
                lines.push_back(s = text.substr(prev, pos - prev));
                int sz = (int)(s.size());
                width = max(sz, width);
                prev = pos + 1;
            } lines.push_back(text.substr(prev));

            for (auto & line : lines) while (line.size() < width)
                line.append(" ");

            this -> lns = lines;

            for (int y = 0; y < lns.size(); y++) for (int x = 0; x < lns[y].size(); x++) {
                char c = lns[y].at(x);
                if (c == ':')
                    nts.emplace_back(Ant(x, y));
                else if (c == '.')
                    phrs.emplace_back(Pheromone(x, y));
                else if (c == '-' || c == '|')
                    wls.emplace_back(Wall(x, y));
                else if (c == '>')
                    gts.emplace_back(Gate(x, y, 2));
                else if (c == '^')
                    gts.emplace_back(Gate(x, y, 1));
                else if (c == '<')
                    gts.emplace_back(Gate(x, y, 0));
                else if (c == '~')
                    gts.emplace_back(Gate(x, y, 3));
            }

            return *this;
        }